

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void call(ch_context *context,ch_function *function,ch_argcount argcount)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint8_t *puVar4;
  char *error;
  ch_exit exit;
  
  uVar2 = (context->call_stack).size;
  uVar3 = (ulong)uVar2;
  if (uVar3 < 0x100) {
    bVar1 = function->argcount;
    if (bVar1 != argcount) {
      ch_runtime_error(context,EXIT_NOT_ENOUGH_ARGS_IN_STACK,
                       "Incorrect number of arguments passed to function (expected %u, got %u).",
                       (ulong)bVar1,(ulong)argcount);
      return;
    }
    puVar4 = context->pstart + context->data_size + (ulong)function->ptr;
    if ((context->pstart <= puVar4) && (puVar4 < context->pend)) {
      (context->call_stack).size = uVar2 + 1;
      (context->call_stack).calls[uVar3].return_addr = context->pcurrent;
      (context->call_stack).calls[uVar3].stack_addr = (int)(context->stack).size - (uint)bVar1;
      (context->call_stack).calls[uVar3].closure = (ch_closure *)0x0;
      context->pcurrent = puVar4;
      return;
    }
    error = "Function pointer exceeds bounds of program.";
    exit = EXIT_INVALID_INSTRUCTION_POINTER;
  }
  else {
    error = "Stack limit reached.";
    exit = EXIT_STACK_SIZE_EXCEEDED;
  }
  ch_runtime_error(context,exit,error);
  return;
}

Assistant:

static void call(ch_context *context, ch_function *function,
                 ch_argcount argcount) {
  if (context->call_stack.size >= CH_CALL_STACK_SIZE) {
    ch_runtime_error(context, EXIT_STACK_SIZE_EXCEEDED, "Stack limit reached.");
    return;
  }

  if (argcount != function->argcount) {
    ch_runtime_error(
        context, EXIT_NOT_ENOUGH_ARGS_IN_STACK,
        "Incorrect number of arguments passed to function (expected %" PRIu8
        ", got %" PRIu8 ").",
        function->argcount, argcount);
    return;
  }

  uint8_t *function_ptr = context->pstart + function->ptr + context->data_size;
  if (!IS_PROGRAM_PTR_SAFE(context, function_ptr)) {
    ch_runtime_error(context, EXIT_INVALID_INSTRUCTION_POINTER,
                     "Function pointer exceeds bounds of program.");
    return;
  }

  ch_call *call = &context->call_stack.calls[context->call_stack.size++];
  call->return_addr = context->pcurrent;
  call->stack_addr = CH_STACK_ADDR(&context->stack) - function->argcount;
  call->closure = NULL;

  context->pcurrent = function_ptr;
}